

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall TPZFMatrix<long_double>::InitializePivot(TPZFMatrix<long_double> *this)

{
  int64_t iVar1;
  int *piVar2;
  TPZBaseMatrix *in_RDI;
  int64_t in_stack_00000008;
  int64_t i;
  int nRows;
  long local_18;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  TPZManVector<int,_5>::Resize((TPZManVector<int,_5> *)i,in_stack_00000008);
  for (local_18 = 0; local_18 < (int)iVar1; local_18 = local_18 + 1) {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI[1].fDecomposed,local_18);
    *piVar2 = (int)local_18 + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::InitializePivot()
{
    const int nRows = this->Rows();
    fPivot.Resize(nRows);
    for(int64_t i = 0; i < nRows; i++){
        fPivot[i] = i+1; // Fortran based indexing
    }
}